

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

_Bool ssl_prefs_check(Curl_easy *data)

{
  ulong uVar1;
  
  uVar1 = (data->set).ssl.primary.version;
  if (7 < uVar1) {
    Curl_failf(data,"Unrecognized parameter value passed via CURLOPT_SSLVERSION");
  }
  return uVar1 < 8;
}

Assistant:

static bool ssl_prefs_check(struct Curl_easy *data)
{
  /* check for CURLOPT_SSLVERSION invalid parameter value */
  if((data->set.ssl.primary.version < 0)
     || (data->set.ssl.primary.version >= CURL_SSLVERSION_LAST)) {
    failf(data, "Unrecognized parameter value passed via CURLOPT_SSLVERSION");
    return FALSE;
  }
  return TRUE;
}